

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

QString * __thiscall
DebugDirEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirEntryWrapper *this,size_t fieldId)

{
  bool bVar1;
  char *ch;
  
  switch(fieldId) {
  case 0:
    ch = "Characteristics";
    break;
  case 1:
    if ((this->dbgRootDir == (DebugDirWrapper *)0x0) ||
       (bVar1 = DebugDirWrapper::isRepro(this->dbgRootDir), !bVar1)) {
      ch = "TimeDateStamp";
    }
    else {
      ch = "ReproChecksum";
    }
    break;
  case 2:
    ch = "MajorVersion";
    break;
  case 3:
    ch = "MinorVersion";
    break;
  case 4:
    ch = "Type";
    break;
  case 5:
    ch = "SizeOfData";
    break;
  case 6:
    ch = "AddressOfRawData";
    break;
  case 7:
    ch = "PointerToRawData";
    break;
  default:
    (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
      super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirEntryWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: return (dbgRootDir && dbgRootDir->isRepro()) ? "ReproChecksum" :"TimeDateStamp";
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case TYPE: return "Type";
        case DATA_SIZE: return "SizeOfData";
        case RAW_DATA_ADDR: return "AddressOfRawData";
        case RAW_DATA_PTR: return "PointerToRawData";
    }
    return getName();
}